

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O1

Index __thiscall
wasm::anon_unknown_0::AsyncifyLocals::getFakeCallLocal(AsyncifyLocals *this,Type type)

{
  undefined1 auVar1 [16];
  Index IVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  Type in_R8;
  key_type local_28;
  Type type_local;
  
  local_28.id = type.id;
  iVar3 = std::
          _Hashtable<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->fakeCallLocals)._M_h,&local_28);
  if (iVar3.super__Node_iterator_base<std::pair<const_wasm::Type,_unsigned_int>,_true>._M_cur ==
      (__node_type *)0x0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_28.id;
    IVar2 = Builder::addVar((Builder *)
                            (this->
                            super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>_>
                            ).
                            super_PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                            .
                            super_Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                            .currFunction,(Function *)0x0,(Name)(auVar1 << 0x40),in_R8);
    pmVar4 = std::__detail::
             _Map_base<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->fakeCallLocals,&local_28);
    *pmVar4 = IVar2;
  }
  else {
    IVar2 = *(Index *)((long)iVar3.
                             super__Node_iterator_base<std::pair<const_wasm::Type,_unsigned_int>,_true>
                             ._M_cur + 0x10);
  }
  return IVar2;
}

Assistant:

Index getFakeCallLocal(Type type) {
    auto iter = fakeCallLocals.find(type);
    if (iter != fakeCallLocals.end()) {
      return iter->second;
    }
    return fakeCallLocals[type] = builder->addVar(getFunction(), type);
  }